

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O2

error_code libtorrent::natpmp::from_result_code(int version,int result)

{
  error_code eVar2;
  undefined1 auVar3 [12];
  error_category *peVar4;
  error_code eVar1;
  
  if ((version == 0) && (result - 3U < 3)) {
    result = *(int *)(&DAT_003838a8 + (ulong)(result - 3U) * 4);
  }
  eVar1 = errors::make_error_code(result);
  eVar2.val_ = eVar1.val_;
  auVar3[4] = eVar1.failed_;
  auVar3._5_3_ = eVar1._5_3_;
  register0x00000010 = eVar1.cat_;
  return eVar2;
}

Assistant:

error_code natpmp::from_result_code(int const version, int result)
{
	if (version == version_natpmp)
	{
		// a few nat-pmp result codes map to different codes
		// in pcp
		switch (result)
		{
		case 3:result = 7; break;
		case 4:result = 8; break;
		case 5:result = 4; break;
		}
	}
	return errors::pcp_errors(result);
}